

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::AtomicCounterBufferStorageTestCase::initTestCaseIteration
          (AtomicCounterBufferStorageTestCase *this,GLuint sparse_bo)

{
  uint uVar1;
  GLenum GVar2;
  uint uVar3;
  uint uVar4;
  
  this->m_sparse_bo = sparse_bo;
  (*this->m_gl->bindBuffer)(0x8892,sparse_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x474);
  uVar4 = this->m_helper_bo_size_rounded;
  uVar1 = this->m_page_size;
  uVar3 = uVar4;
  if (this->m_all_pages_committed == false) {
    uVar3 = uVar4 - uVar4 % uVar1 >> 1;
  }
  uVar4 = uVar1 - (uVar4 >> 1);
  this->m_sparse_bo_data_start_offset = uVar4;
  this->m_sparse_bo_data_start_offset_rounded = 0;
  this->m_sparse_bo_data_size = uVar3;
  uVar4 = uVar4 + uVar3;
  uVar4 = (uVar1 - uVar4 % uVar1) % uVar1 + uVar4;
  this->m_sparse_bo_data_size_rounded = uVar4;
  (*this->m_gl->bufferPageCommitmentARB)(0x8892,0,(ulong)uVar4,'\x01');
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x49e);
  return true;
}

Assistant:

bool AtomicCounterBufferStorageTestCase::initTestCaseIteration(glw::GLuint sparse_bo)
{
	bool result = true;

	/* Cache the BO id, if not cached already */
	DE_ASSERT(m_sparse_bo == 0 || m_sparse_bo == sparse_bo);

	m_sparse_bo = sparse_bo;

	/* Set up the sparse bufffer. */
	int sparse_bo_data_size = 0;

	DE_ASSERT(m_helper_bo_size_rounded != 0);

	m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	if (m_all_pages_committed)
	{
		/* Commit all required pages */
		sparse_bo_data_size = m_helper_bo_size_rounded;
	}
	else
	{
		/* Only commit the first half of the required pages */
		DE_ASSERT((m_helper_bo_size_rounded % m_page_size) == 0);

		sparse_bo_data_size = (m_helper_bo_size_rounded / m_page_size) * m_page_size / 2;
	}

	/* NOTE: We need to ensure that the memory region assigned to the atomic counter buffer spans
	 *       at least through two separate pages.
	 *
	 * Since we align up, we need to move one page backward and then apply the alignment function
	 * to determine the start page index.
	 */
	const int sparse_bo_data_start_offset			 = m_page_size - m_helper_bo_size_rounded / 2;
	int		  sparse_bo_data_start_offset_minus_page = sparse_bo_data_start_offset - m_page_size;

	if (sparse_bo_data_start_offset_minus_page < 0)
	{
		sparse_bo_data_start_offset_minus_page = 0;
	}

	m_sparse_bo_data_start_offset = sparse_bo_data_start_offset;
	m_sparse_bo_data_start_offset_rounded =
		SparseBufferTestUtilities::alignOffset(sparse_bo_data_start_offset_minus_page, m_page_size);
	m_sparse_bo_data_size = sparse_bo_data_size;
	m_sparse_bo_data_size_rounded =
		SparseBufferTestUtilities::alignOffset(m_sparse_bo_data_start_offset + sparse_bo_data_size, m_page_size);

	DE_ASSERT((m_sparse_bo_data_size_rounded % m_page_size) == 0);
	DE_ASSERT((m_sparse_bo_data_start_offset_rounded % m_page_size) == 0);

	m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, m_sparse_bo_data_start_offset_rounded, m_sparse_bo_data_size_rounded,
								 GL_TRUE); /* commit */

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

	return result;
}